

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O1

string * phosg::parse_data_string
                   (string *__return_storage_ptr__,string *s,string *mask,uint64_t flags)

{
  byte *pbVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  ushort uVar6;
  uint uVar7;
  char *pcVar8;
  ulonglong uVar9;
  uint uVar10;
  size_type sVar11;
  _Alloc_hider _Var12;
  byte __c;
  bool bVar13;
  bool bVar14;
  float fVar15;
  char *in;
  int16_t value;
  string filename;
  byte local_c1;
  byte *local_c0;
  string *local_b8;
  string *local_b0;
  ulong local_a8;
  uint local_9c;
  uint local_98;
  uint local_94;
  string local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  ulong local_68;
  ulong local_60;
  string local_58;
  ulong local_38;
  
  local_c0 = (byte *)(s->_M_dataplus)._M_p;
  local_70 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_70;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (mask != (string *)0x0) {
    mask->_M_string_length = 0;
    *(mask->_M_dataplus)._M_p = '\0';
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  bVar14 = true;
  __c = 0;
  local_98 = 0;
  local_9c = 0;
  bVar13 = false;
  local_94 = 0;
  local_68 = 0;
  local_a8 = 0;
  local_c1 = 1;
  local_60 = 0;
  local_b8 = mask;
  local_38 = flags;
  do {
    pbVar1 = local_c0;
    bVar5 = *local_c0;
    if (bVar5 == 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p == &local_58.field_2) {
        return __return_storage_ptr__;
      }
      sVar11 = CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                        local_58.field_2._M_local_buf[0]);
      _Var12._M_p = local_58._M_dataplus._M_p;
      goto LAB_00111ba7;
    }
    if (bVar13) {
      bVar3 = false;
      if (bVar5 == 10) {
        bVar13 = false;
      }
LAB_001113e7:
      local_c0 = local_c0 + 1;
LAB_00111842:
      bVar4 = true;
      if (bVar3) {
        if (bVar14) {
          __c = __c << 4;
        }
        else {
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back(__return_storage_ptr__,__c);
          if (local_b8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            __c = 0;
          }
          else {
            __c = 0;
            ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_replace_aux(local_b8,local_b8->_M_string_length,0,1,-local_c1);
          }
        }
        bVar14 = (bool)(bVar14 ^ 1);
      }
    }
    else {
      if ((local_94 & 1) != 0) {
        if ((bVar5 != 0x2a) || (local_c0[1] != 0x2f)) goto LAB_00111838;
        local_c0 = local_c0 + 2;
        local_94 = 0;
LAB_00111840:
        bVar3 = false;
        goto LAB_00111842;
      }
      if ((local_98 & 1) == 0) {
        if ((local_9c & 1) == 0) {
          if ((local_68 & 1) == 0) {
            if (bVar5 < 0x25) {
              if (bVar5 != 0x23) {
                if (bVar5 == 0x24) {
                  local_a8 = local_a8 ^ 1;
                  goto LAB_00111838;
                }
LAB_001116a0:
                if ((byte)(bVar5 - 0x30) < 10) {
                  cVar2 = -0x30;
                }
                else {
                  if (5 < (byte)(bVar5 + 0xbf)) {
                    if ((byte)(bVar5 + 0x9f) < 6) {
                      __c = bVar5 + 0xa9 | __c;
                      bVar3 = true;
                      goto LAB_001113e7;
                    }
                    if (bVar5 < 0x2f) {
                      if (bVar5 == 0x22) {
                        local_98 = 1;
                      }
                      else if (bVar5 == 0x27) {
                        local_9c = 1;
                      }
                    }
                    else if (bVar5 == 0x2f) {
                      if (local_c0[1] == 0x2f) {
                        bVar13 = true;
                      }
                      else {
                        if (local_c0[1] != 0x2a) goto LAB_00111af7;
                        local_94 = 1;
                      }
                    }
                    else {
LAB_00111af7:
                      if ((bVar5 == 0x3c) && ((local_38 & 1) != 0)) {
                        local_58._M_string_length = 0;
                        *local_58._M_dataplus._M_p = '\0';
                        local_68 = CONCAT71((int7)((ulong)local_58._M_dataplus._M_p >> 8),1);
                      }
                    }
                    bVar3 = false;
                    goto LAB_001113e7;
                  }
                  cVar2 = -0x37;
                }
                __c = bVar5 + cVar2 | __c;
                bVar3 = true;
                goto LAB_001113e7;
              }
              pbVar1 = local_c0 + 1;
              if (local_c0[1] == 0x23) {
                pbVar1 = local_c0 + 2;
                if (local_c0[2] == 0x23) {
                  pbVar1 = local_c0 + 3;
                  if (local_c0[3] == 0x23) {
                    local_c0 = local_c0 + 4;
                    pcVar8 = (char *)strtoull((char *)local_c0,(char **)&local_c0,0);
                    local_90._M_dataplus._M_p =
                         (char *)((ulong)pcVar8 >> 0x38 | ((ulong)pcVar8 & 0xff000000000000) >> 0x28
                                  | ((ulong)pcVar8 & 0xff0000000000) >> 0x18 |
                                  ((ulong)pcVar8 & 0xff00000000) >> 8 |
                                  ((ulong)pcVar8 & 0xff000000) << 8 |
                                  ((ulong)pcVar8 & 0xff0000) << 0x18 |
                                  ((ulong)pcVar8 & 0xff00) << 0x28 | (long)pcVar8 << 0x38);
                    if ((local_a8 & 1) == 0) {
                      local_90._M_dataplus._M_p = pcVar8;
                    }
                    ::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                              (__return_storage_ptr__,(char *)&local_90,8);
                    if (local_b8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      ::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                      _M_replace_aux(local_b8,local_b8->_M_string_length,0,8,-local_c1);
                    }
                  }
                  else {
                    local_c0 = pbVar1;
                    uVar9 = strtoull((char *)pbVar1,(char **)&local_c0,0);
                    uVar7 = (uint)uVar9;
                    uVar10 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                             uVar7 << 0x18;
                    if ((local_a8 & 1) == 0) {
                      uVar10 = uVar7;
                    }
                    local_90._M_dataplus._M_p._0_4_ = (float)uVar10;
                    ::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                              (__return_storage_ptr__,(char *)&local_90,4);
                    if (local_b8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      ::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                      _M_replace_aux(local_b8,local_b8->_M_string_length,0,4,-local_c1);
                    }
                  }
                }
                else {
                  local_c0 = pbVar1;
                  uVar9 = strtoull((char *)pbVar1,(char **)&local_c0,0);
                  uVar6 = (ushort)uVar9;
                  if ((local_a8 & 1) != 0) {
                    uVar6 = uVar6 << 8 | uVar6 >> 8;
                  }
                  local_90._M_dataplus._M_p._0_2_ = uVar6;
                  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                  ::append(__return_storage_ptr__,(char *)&local_90,2);
                  if (local_b8 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    ::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                    _M_replace_aux(local_b8,local_b8->_M_string_length,0,2,-local_c1);
                  }
                }
              }
              else {
                local_c0 = pbVar1;
                uVar9 = strtoull((char *)pbVar1,(char **)&local_c0,0);
                ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_replace_aux(__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,1,
                               (char)uVar9);
                if (local_b8 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  bVar3 = false;
                  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                  ::_M_replace_aux(local_b8,local_b8->_M_string_length,0,1,-local_c1);
                  goto LAB_00111842;
                }
              }
            }
            else {
              if (bVar5 != 0x25) {
                if (bVar5 != 0x3f) goto LAB_001116a0;
                local_c1 = local_c1 ^ 1;
                goto LAB_00111838;
              }
              pbVar1 = local_c0 + 1;
              if (local_c0[1] == 0x25) {
                local_c0 = local_c0 + 2;
                local_90._M_dataplus._M_p = (pointer)strtod((char *)local_c0,(char **)&local_c0);
                if ((local_a8 & 1) != 0) {
                  local_90._M_dataplus._M_p =
                       (pointer)((ulong)local_90._M_dataplus._M_p >> 0x38 |
                                 ((ulong)local_90._M_dataplus._M_p & 0xff000000000000) >> 0x28 |
                                 ((ulong)local_90._M_dataplus._M_p & 0xff0000000000) >> 0x18 |
                                 ((ulong)local_90._M_dataplus._M_p & 0xff00000000) >> 8 |
                                 ((ulong)local_90._M_dataplus._M_p & 0xff000000) << 8 |
                                 ((ulong)local_90._M_dataplus._M_p & 0xff0000) << 0x18 |
                                 ((ulong)local_90._M_dataplus._M_p & 0xff00) << 0x28 |
                                (long)local_90._M_dataplus._M_p << 0x38);
                }
                ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(__return_storage_ptr__,(char *)&local_90,8);
                if (local_b8 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                  ::_M_replace_aux(local_b8,local_b8->_M_string_length,0,8,-local_c1);
                }
              }
              else {
                local_c0 = pbVar1;
                fVar15 = strtof((char *)pbVar1,(char **)&local_c0);
                if ((local_a8 & 1) != 0) {
                  fVar15 = (float)((uint)fVar15 >> 0x18 | ((uint)fVar15 & 0xff0000) >> 8 |
                                   ((uint)fVar15 & 0xff00) << 8 | (int)fVar15 << 0x18);
                }
                local_90._M_dataplus._M_p._0_4_ = fVar15;
                ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(__return_storage_ptr__,(char *)&local_90,4);
                if (local_b8 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                  ::_M_replace_aux(local_b8,local_b8->_M_string_length,0,4,-local_c1);
                }
              }
            }
            goto LAB_00111840;
          }
          if (bVar5 == 0x3e) {
            sVar11 = __return_storage_ptr__->_M_string_length;
            load_file(&local_90,&local_58);
            ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(__return_storage_ptr__,local_90._M_dataplus._M_p,local_90._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            }
            if (local_b8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              local_68 = 0;
            }
            else {
              local_68 = 0;
              ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_replace_aux(local_b8,local_b8->_M_string_length,0,
                             __return_storage_ptr__->_M_string_length - sVar11,-local_c1);
            }
          }
          else {
            ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_replace_aux((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_58,local_58._M_string_length,0,1,bVar5);
          }
        }
        else {
          if (bVar5 == 0x5c) {
            bVar5 = local_c0[1];
            local_b0 = __return_storage_ptr__;
            if (bVar5 == 0) {
              local_60 = 1;
            }
            else {
              if (bVar5 == 0x74) {
                local_90._M_dataplus._M_p._0_2_ = 9;
              }
              else if (bVar5 == 0x72) {
                local_90._M_dataplus._M_p._0_2_ = 0xd;
              }
              else if (bVar5 == 0x6e) {
                local_90._M_dataplus._M_p._0_2_ = 10;
              }
              else {
                local_90._M_dataplus._M_p._0_2_ = (short)(char)bVar5;
              }
              if ((local_a8 & 1) != 0) {
                local_90._M_dataplus._M_p._0_2_ =
                     (ushort)local_90._M_dataplus._M_p << 8 | (ushort)local_90._M_dataplus._M_p >> 8
                ;
              }
              ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(__return_storage_ptr__,(char *)&local_90,2);
              if (local_b8 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_replace_aux(local_b8,local_b8->_M_string_length,0,2,-local_c1);
              }
              local_c0 = pbVar1 + 2;
            }
            bVar4 = false;
            bVar3 = false;
            __return_storage_ptr__ = local_b0;
            if (bVar5 == 0) goto LAB_00111894;
            goto LAB_00111842;
          }
          if (bVar5 == 0x27) {
            local_c0 = local_c0 + 1;
            local_9c = 0;
            goto LAB_00111840;
          }
          bVar5 = *local_c0;
          local_90._M_dataplus._M_p._0_2_ =
               (short)(char)bVar5 << 8 | (ushort)(short)(char)bVar5 >> 8;
          if ((local_a8 & 1) == 0) {
            local_90._M_dataplus._M_p._0_2_ = (short)(char)bVar5;
          }
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (__return_storage_ptr__,(char *)&local_90,2);
          if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_replace_aux(local_b8,local_b8->_M_string_length,0,2,-local_c1);
          }
        }
LAB_00111838:
        local_c0 = pbVar1 + 1;
        goto LAB_00111840;
      }
      if (bVar5 != 0x5c) {
        if (bVar5 != 0x22) {
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back(__return_storage_ptr__,bVar5);
          if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_replace_aux(local_b8,local_b8->_M_string_length,0,1,-local_c1);
          }
          goto LAB_00111838;
        }
        local_c0 = local_c0 + 1;
        local_98 = 0;
        goto LAB_00111840;
      }
      bVar5 = local_c0[1];
      if (0x6d < bVar5) {
        if (bVar5 == 0x74) {
          bVar5 = 9;
        }
        else if (bVar5 == 0x72) {
          bVar5 = 0xd;
        }
        else if (bVar5 == 0x6e) {
          bVar5 = 10;
        }
LAB_001117f5:
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,bVar5);
        if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace_aux(local_b8,local_b8->_M_string_length,0,1,-local_c1);
        }
        local_c0 = pbVar1 + 2;
        goto LAB_00111840;
      }
      if (bVar5 != 0) goto LAB_001117f5;
      local_60 = 1;
      bVar4 = false;
    }
LAB_00111894:
  } while (bVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  if (((local_60 & 1) == 0) &&
     (_Var12._M_p = (__return_storage_ptr__->_M_dataplus)._M_p,
     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)_Var12._M_p != local_70)) {
    sVar11 = local_70->_M_allocated_capacity;
LAB_00111ba7:
    operator_delete(_Var12._M_p,sVar11 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string parse_data_string(const string& s, string* mask, uint64_t flags) {
  bool allow_files = flags & ParseDataFlags::ALLOW_FILES;

  const char* in = s.c_str();

  string data;
  if (mask) {
    mask->clear();
  }

#ifdef PHOSG_BIG_ENDIAN
  constexpr bool host_big_endian = true;
#else
  constexpr bool host_big_endian = false;
#endif

  uint8_t chr = 0;
  bool reading_string = false;
  bool reading_unicode_string = false;
  bool reading_comment = false;
  bool reading_multiline_comment = false;
  bool reading_high_nybble = true;
  bool reading_filename = false;
  bool big_endian = false;
  bool mask_enabled = true;
  string filename;
  while (in[0]) {
    bool read_nybble = 0;

    // if between // and a newline, don't write to output buffer
    if (reading_comment) {
      if (in[0] == '\n') {
        reading_comment = false;
      }
      in++;

      // if between /* and */, don't write to output buffer
    } else if (reading_multiline_comment) {
      if ((in[0] == '*') && (in[1] == '/')) {
        reading_multiline_comment = 0;
        in += 2;
      } else {
        in++;
      }

      // if between quotes, read bytes to output buffer, unescaping where needed
    } else if (reading_string) {
      if (in[0] == '\"') {
        reading_string = 0;
        in++;

      } else if (in[0] == '\\') { // unescape char after a backslash
        if (!in[1]) {
          return data;
        } else if (in[1] == 'n') {
          data += '\n';
        } else if (in[1] == 'r') {
          data += '\r';
        } else if (in[1] == 't') {
          data += '\t';
        } else if (in[1] == '\"') {
          data += '\"';
        } else if (in[1] == '\'') {
          data += '\'';
        } else {
          data += in[1];
        }
        add_mask_bits(mask, mask_enabled, 1);
        in += 2;

      } else {
        data += in[0];
        add_mask_bits(mask, mask_enabled, 1);
        in++;
      }

      // if between single quotes, word-expand bytes to output buffer, unescaping
    } else if (reading_unicode_string) {
      if (in[0] == '\'') {
        reading_unicode_string = 0;
        in++;

      } else if (in[0] == '\\') { // unescape char after a backslash
        int16_t value;
        if (!in[1]) {
          return data;
        } else if (in[1] == 'n') {
          value = '\n';
        } else if (in[1] == 'r') {
          value = '\r';
        } else if (in[1] == 't') {
          value = '\t';
        } else {
          value = in[1];
        }
        if (big_endian != host_big_endian) {
          value = bswap16(value);
        }
        data.append((const char*)&value, 2);
        add_mask_bits(mask, mask_enabled, 2);
        in += 2;

      } else {
        int16_t value = in[0];
        if (big_endian != host_big_endian) {
          value = bswap16(value);
        }
        data.append((const char*)&value, 2);
        add_mask_bits(mask, mask_enabled, 2);
        in++;
      }

      // if between <>, read a file name, then stick that file into the buffer
    } else if (reading_filename) {
      if (in[0] == '>') {
        // TODO: support <filename@offset:size> syntax
        reading_filename = 0;
        size_t pre_size = data.size();
        data += load_file(filename);
        add_mask_bits(mask, mask_enabled, data.size() - pre_size);

      } else {
        filename.append(1, in[0]);
      }
      in++;

      // ? inverts mask_enabled
    } else if (in[0] == '?') {
      mask_enabled = !mask_enabled;
      in++;

      // $ changes the endianness
    } else if (in[0] == '$') {
      big_endian = !big_endian;
      in++;

      // # signifies a decimal number
    } else if (in[0] == '#') { // 8-bit
      in++;
      if (in[0] == '#') { // 16-bit
        in++;
        if (in[0] == '#') { // 32-bit
          in++;
          if (in[0] == '#') { // 64-bit
            in++;
            uint64_t value = strtoull(in, const_cast<char**>(&in), 0);
            if (big_endian != host_big_endian) {
              value = bswap64(value);
            }
            data.append((const char*)&value, 8);
            add_mask_bits(mask, mask_enabled, 8);

          } else {
            uint32_t value = strtoull(in, const_cast<char**>(&in), 0);
            if (big_endian != host_big_endian) {
              value = bswap32(value);
            }
            data.append((const char*)&value, 4);
            add_mask_bits(mask, mask_enabled, 4);
          }

        } else {
          uint16_t value = strtoull(in, const_cast<char**>(&in), 0);
          if (big_endian != host_big_endian) {
            value = bswap16(value);
          }
          data.append((const char*)&value, 2);
          add_mask_bits(mask, mask_enabled, 2);
        }

      } else {
        data.append(1, (char)strtoull(in, const_cast<char**>(&in), 0));
        add_mask_bits(mask, mask_enabled, 1);
      }

      // % is a float, %% is a double
    } else if (in[0] == '%') {
      in++;
      if (in[0] == '%') {
        in++;

        uint64_t value;
        *(double*)&value = strtod(in, const_cast<char**>(&in));
        if (big_endian != host_big_endian) {
          value = bswap64(value);
        }
        data.append((const char*)&value, 8);
        add_mask_bits(mask, mask_enabled, 8);

      } else {
        uint32_t value;
        *(float*)&value = strtof(in, const_cast<char**>(&in));
        if (big_endian != host_big_endian) {
          value = bswap32(value);
        }
        data.append((const char*)&value, 4);
        add_mask_bits(mask, mask_enabled, 4);
      }

      // anything else is a hex digit
    } else {
      if ((in[0] >= '0') && (in[0] <= '9')) {
        read_nybble = true;
        chr |= (in[0] - '0');

      } else if ((in[0] >= 'A') && (in[0] <= 'F')) {
        read_nybble = true;
        chr |= (in[0] - 'A' + 0x0A);

      } else if ((in[0] >= 'a') && (in[0] <= 'f')) {
        read_nybble = true;
        chr |= (in[0] - 'a' + 0x0A);

      } else if (in[0] == '\"') {
        reading_string = true;

      } else if (in[0] == '\'') {
        reading_unicode_string = 1;

      } else if ((in[0] == '/') && (in[1] == '/')) {
        reading_comment = 1;

      } else if ((in[0] == '/') && (in[1] == '*')) {
        reading_multiline_comment = 1;

      } else if (in[0] == '<' && allow_files) {
        reading_filename = 1;
        filename.clear();
      }
      in++;
    }

    if (read_nybble) {
      if (reading_high_nybble) {
        chr = chr << 4;
      } else {
        data += (char)chr;
        add_mask_bits(mask, mask_enabled, 1);
        chr = 0;
      }
      reading_high_nybble = !reading_high_nybble;
    }
  }
  return data;
}